

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

void __thiscall
ON_Mesh::InvalidateCachedTextureCoordinates
          (ON_Mesh *this,bool bOnlyInvalidateCachedSurfaceParameterMapping)

{
  bool bVar1;
  undefined7 in_register_00000031;
  long lVar2;
  ulong uVar3;
  
  if ((int)CONCAT71(in_register_00000031,bOnlyInvalidateCachedSurfaceParameterMapping) != 0) {
    uVar3 = (ulong)(this->m_TC).m_count;
    if (0 < (long)uVar3) {
      lVar2 = uVar3 * 0xb8 + -0xa8;
      do {
        if (*(int *)((((this->m_TC).m_a)->m_tag).m_mapping_id.Data4 + lVar2 + -8) == 1) {
          ON_ClassArray<ON_TextureCoordinates>::Remove(&this->m_TC,(int)uVar3 + -1);
        }
        lVar2 = lVar2 + -0xb8;
        bVar1 = 1 < uVar3;
        uVar3 = uVar3 - 1;
      } while (bVar1);
    }
    return;
  }
  ON_ClassArray<ON_TextureCoordinates>::SetCapacity(&this->m_TC,0);
  return;
}

Assistant:

void ON_Mesh::InvalidateCachedTextureCoordinates(bool bOnlyInvalidateCachedSurfaceParameterMapping)
{
  if (bOnlyInvalidateCachedSurfaceParameterMapping)
  {
    for (int i = m_TC.Count() - 1; i >= 0; i--)
    {
      if (m_TC[i].m_tag.m_mapping_type == ON_TextureMapping::TYPE::srfp_mapping)
      {
        m_TC.Remove(i);
      }
    }
  }
  else
  {
    m_TC.Destroy();
  }
}